

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O2

int __thiscall HashTable<int>::Find(HashTable<int> *this,int value)

{
  int iVar1;
  node *pnVar2;
  
  if (this->HashArray[value % 0x13].value == value) {
    return 1;
  }
  pnVar2 = this->HashArray + value % 0x13;
  iVar1 = 1;
  do {
    pnVar2 = pnVar2->next;
    if (pnVar2 == (node *)0x0) {
      return 0;
    }
    iVar1 = iVar1 + 1;
  } while (pnVar2->value != value);
  return iVar1;
}

Assistant:

int Find(DataType value) {
		int count = 1;
		int address = GetHashAddress(value);
		if (HashArray[address].value == value)
			return count;
		else {
			Node *p = HashArray[address].next;
			while (p != NULL) {
				count++;
				if (p->value == value)
					return count;
				p = p->next;
			}
		}
		return 0;   //没找到
	}